

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteEnumDocComment(Printer *printer,EnumDescriptor *enum_)

{
  bool bVar1;
  undefined1 auStack_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  EscapeJavadoc((string *)auStack_68,*(string **)(enum_ + 8));
  io::Printer::Print(printer,"/**\n * Protobuf enum {@code $fullname$}\n","fullname",
                     (string *)auStack_68);
  std::__cxx11::string::~string((string *)auStack_68);
  auStack_68._16_8_ = &local_48;
  auStack_68._24_8_ = 0;
  local_48._M_local_buf[0] = '\0';
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  bVar1 = EnumDescriptor::GetSourceLocation(enum_,(SourceLocation *)auStack_68);
  if (bVar1) {
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)auStack_68);
  }
  SourceLocation::~SourceLocation((SourceLocation *)auStack_68);
  io::Printer::Print(printer," */\n");
  return;
}

Assistant:

void WriteEnumDocComment(io::Printer* printer, const EnumDescriptor* enum_) {
  printer->Print(
    "/**\n"
    " * Protobuf enum {@code $fullname$}\n",
    "fullname", EscapeJavadoc(enum_->full_name()));
  WriteDocCommentBody(printer, enum_);
  printer->Print(" */\n");
}